

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionUtils.cpp
# Opt level: O2

double DIS::ConversionUtils::getRollFromEuler
                 (double lat,double lon,double psi,double theta,double phi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  dVar1 = sin(lat);
  dVar2 = sin(lon);
  dVar3 = cos(lon);
  dVar4 = cos(lat);
  dVar5 = cos(theta);
  dVar6 = sin(theta);
  dVar7 = cos(psi);
  dVar8 = sin(psi);
  dVar9 = sin(phi);
  dVar10 = cos(phi);
  dVar1 = atan2(-(dVar5 * dVar9 * dVar1 +
                 (dVar7 * dVar6 * dVar9 - dVar10 * dVar8) * dVar3 * dVar4 +
                 (dVar10 * dVar7 + dVar6 * dVar9 * dVar8) * dVar2 * dVar4),
                -(dVar5 * dVar10 * dVar1 +
                 (dVar9 * dVar8 + dVar7 * dVar6 * dVar10) * dVar3 * dVar4 +
                 (dVar6 * dVar10 * dVar8 - dVar9 * dVar7) * dVar2 * dVar4));
  return dVar1 * 57.29577951308238;
}

Assistant:

double ConversionUtils::getRollFromEuler(double lat, double lon, double psi, double theta, double phi)
{
    double sinlat = sin(lat);
    double sinlon = sin(lon);
    double coslon = cos(lon);
    double coslat = cos(lat);
    double cosLatCosLon = coslat * coslon;
    double cosLatSinLon = coslat * sinlon;

    double cosTheta = cos(theta);
    double sinTheta = sin(theta);
    double cosPsi = cos(psi);
    double sinPsi = sin(psi);
    double sinPhi = sin(phi);
    double cosPhi = cos(phi);

    double sinPhiSinTheta = sinPhi * sinTheta;
    double cosPhiSinTheta = cosPhi * sinTheta;

    double b23 = cosLatCosLon * (-cosPhi * sinPsi + sinPhiSinTheta * cosPsi)
                 + cosLatSinLon * (cosPhi * cosPsi + sinPhiSinTheta * sinPsi)
                 + sinlat * (sinPhi * cosTheta);

    double b33 = cosLatCosLon * (sinPhi * sinPsi + cosPhiSinTheta * cosPsi)
                 + cosLatSinLon * (-sinPhi * cosPsi + cosPhiSinTheta * sinPsi)
                 + sinlat * (cosPhi * cosTheta);

    return radToDeg(atan2(-b23, -b33));
}